

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  TValue *pTVar1;
  UpVal **ppUVar2;
  UpVal *pUVar3;
  uint uVar4;
  
  pTVar1 = index2addr(L,fidx);
  uVar4 = pTVar1->tt_ & 0x3f;
  if (uVar4 == 0x26) {
    pUVar3 = (UpVal *)((pTVar1->value_).gc + (long)n + 1);
  }
  else if (uVar4 == 6) {
    ppUVar2 = getupvalref(L,fidx,n,(LClosure **)0x0);
    pUVar3 = *ppUVar2;
  }
  else {
    pUVar3 = (UpVal *)0x0;
  }
  return pUVar3;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  StkId fi = index2addr(L, fidx);
  switch (ttype(fi)) {
    case LUA_TLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL);
    }
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      api_check(L, 1 <= n && n <= f->nupvalues, "invalid upvalue index");
      return &f->upvalue[n - 1];
    }
    default: {
      api_check(L, 0, "closure expected");
      return NULL;
    }
  }
}